

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_handshake(ptls_t *tls,ptls_buffer_t *sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  anon_enum_32 aVar4;
  size_t sVar5;
  ptls_context_t *ppVar6;
  ptls_hash_algorithm_t *algo;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ptls_key_exchange_algorithm_t *ppVar10;
  st_ptls_hash_context_t *psVar11;
  int iVar12;
  uint uVar13;
  st_ptls_key_schedule_t *sched;
  ptls_cipher_suite_t **pppVar14;
  uint64_t uVar15;
  ulong uVar16;
  uint8_t description;
  long lVar17;
  size_t sVar18;
  ptls_cipher_suite_t *ppVar19;
  void *pvVar20;
  ptls_key_exchange_algorithm_t **pppVar21;
  long lVar22;
  ushort *puVar23;
  uint8_t *puVar24;
  uint8_t *end;
  size_t sVar25;
  long lVar26;
  ptls_iovec_t ikm;
  uint32_t max_early_data_size;
  undefined1 local_1ae;
  undefined1 local_1ad;
  ushort local_1ac;
  undefined1 local_1aa;
  undefined1 local_1a9;
  ushort *local_1a8;
  size_t *local_1a0;
  size_t consumed;
  uint32_t age_add;
  size_t local_188;
  uint32_t lifetime;
  undefined2 local_17a;
  undefined2 local_178;
  undefined2 local_176;
  ushort local_174 [10];
  ptls_cipher_suite_t *local_160;
  ptls_buffer_t decryptbuf;
  uint8_t decryptbuf_small [256];
  
  aVar4 = tls->state;
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < aVar4) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x8e5,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  sVar5 = sendbuf->off;
  if (aVar4 == PTLS_STATE_CLIENT_SEND_EARLY_DATA) {
    uVar13 = send_alert(tls,sendbuf,'\x01','\x01');
    if (uVar13 != 0) {
      return uVar13;
    }
    tls->state = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
  }
  else if (aVar4 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
    if ((input != (void *)0x0) && (*inlen != 0)) {
      __assert_fail("input == NULL || *inlen == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                    ,0x8ea,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    ppVar6 = tls->ctx;
    algo = (*ppVar6->cipher_suites)->hash;
    if (properties == (ptls_handshake_properties_t *)0x0) {
      puVar23 = (ushort *)0x0;
      uVar16 = 0;
      ppVar19 = (ptls_cipher_suite_t *)0x0;
      local_1a0 = (size_t *)0x0;
    }
    else {
      puVar24 = (properties->client).session_ticket.base;
      if (puVar24 == (uint8_t *)0x0) {
        uVar16 = 0;
        ppVar19 = (ptls_cipher_suite_t *)0x0;
        local_1a0 = (size_t *)0x0;
        puVar23 = (ushort *)0x0;
      }
      else {
        end = puVar24 + (properties->client).session_ticket.len;
        decryptbuf_small._0_8_ = puVar24;
        iVar12 = decode64(&consumed,(uint8_t **)decryptbuf_small,end);
        local_1a0 = (size_t *)0x0;
        if (iVar12 != 0) {
          ppVar19 = (ptls_cipher_suite_t *)0x0;
          goto LAB_0010ca58;
        }
        if (((long)end - decryptbuf_small._0_8_ < 2) ||
           ((ulong)((long)end - (decryptbuf_small._0_8_ + 2)) < 3)) {
LAB_0010ca56:
          ppVar19 = (ptls_cipher_suite_t *)0x0;
        }
        else {
          uVar3 = *(ushort *)decryptbuf_small._0_8_;
          lVar26 = 0;
          uVar16 = 0;
          do {
            uVar16 = (ulong)*(byte *)(decryptbuf_small._0_8_ + 2 + lVar26) | uVar16 << 8;
            lVar26 = lVar26 + 1;
          } while (lVar26 != 3);
          puVar24 = (uint8_t *)(decryptbuf_small._0_8_ + 5);
          if ((ulong)((long)end - (long)puVar24) < uVar16) goto LAB_0010ca56;
          puVar23 = (ushort *)(puVar24 + uVar16);
          iVar12 = decode_new_session_ticket
                             (&lifetime,&age_add,(ptls_iovec_t *)&decryptbuf,&max_early_data_size,
                              puVar24,(uint8_t *)puVar23);
          ppVar19 = (ptls_cipher_suite_t *)0x0;
          if ((1 < (ulong)((long)end - (long)puVar23)) && (iVar12 == 0)) {
            uVar16 = (ulong)(ushort)(*puVar23 << 8 | *puVar23 >> 8);
            local_1a8 = puVar23 + 1;
            if ((uint8_t *)((long)puVar23 + uVar16 + 2) != end ||
                (ulong)((long)end - (long)local_1a8) < uVar16) goto LAB_0010ca56;
            pppVar14 = ppVar6->cipher_suites;
            do {
              ppVar19 = *pppVar14;
              if (ppVar19 == (ptls_cipher_suite_t *)0x0) goto LAB_0010ca56;
              pppVar14 = pppVar14 + 1;
            } while (ppVar19->id != (uint16_t)(uVar3 << 8 | uVar3 >> 8));
            uVar15 = gettime_millis();
            if ((consumed <= uVar15) && (uVar15 - consumed < 0x240c8400)) {
              local_1a0 = (size_t *)(ulong)((int)(uVar15 - consumed) + age_add);
              if (ppVar19->hash == algo) {
                puVar1 = &(tls->field_7).client.field_0x20;
                *puVar1 = *puVar1 | 1;
                puVar23 = local_1a8;
                if (((ulong)max_early_data_size != 0) &&
                   ((properties->client).max_early_data_size != (ulong *)0x0)) {
                  *(properties->client).max_early_data_size = (ulong)max_early_data_size;
                  puVar1 = &(tls->field_7).client.field_0x20;
                  *puVar1 = *puVar1 | 2;
                }
              }
              else {
                uVar16 = 0;
                puVar23 = (ushort *)0x0;
              }
              goto LAB_0010ca6b;
            }
          }
        }
LAB_0010ca58:
        uVar16 = 0;
        puVar23 = (ushort *)0x0;
      }
LAB_0010ca6b:
      if (((properties->client).max_early_data_size != (size_t *)0x0) &&
         (((tls->field_7).client.field_0x20 & 2) == 0)) {
        *(properties->client).max_early_data_size = 0;
      }
    }
    sched = key_schedule_new(algo);
    tls->key_schedule = sched;
    ikm.len = uVar16;
    ikm.base = (uint8_t *)puVar23;
    uVar13 = key_schedule_extract(sched,ikm);
    if (uVar13 == 0) {
      sVar5 = sendbuf->off;
      lifetime._0_2_ = 0x316;
      lifetime._2_1_ = 1;
      uVar13 = ptls_buffer__do_pushv(sendbuf,&lifetime,3);
      if ((uVar13 == 0) && (uVar13 = ptls_buffer__do_pushv(sendbuf,"",2), uVar13 == 0)) {
        sVar7 = sendbuf->off;
        local_1a9 = 1;
        uVar13 = ptls_buffer__do_pushv(sendbuf,&local_1a9,1);
        if ((uVar13 == 0) && (uVar13 = ptls_buffer__do_pushv(sendbuf,"",3), uVar13 == 0)) {
          sVar25 = sendbuf->off;
          age_add = CONCAT22(age_add._2_2_,0x303);
          local_1a8 = puVar23;
          uVar13 = ptls_buffer__do_pushv(sendbuf,&age_add,2);
          if ((uVar13 == 0) && (uVar13 = ptls_buffer_reserve(sendbuf,0x20), uVar13 == 0)) {
            (*tls->ctx->random_bytes)(sendbuf->base + sendbuf->off,0x20);
            sendbuf->off = sendbuf->off + 0x20;
            uVar13 = ptls_buffer__do_pushv(sendbuf,"",1);
            if (uVar13 == 0) {
              sendbuf->base[sendbuf->off - 1] = '\0';
              uVar13 = ptls_buffer__do_pushv(sendbuf,"",2);
              if (uVar13 == 0) {
                lVar26 = sVar5 + 5;
                sVar5 = sendbuf->off;
                pppVar14 = tls->ctx->cipher_suites;
                local_160 = ppVar19;
                do {
                  if (*pppVar14 == (ptls_cipher_suite_t *)0x0) {
                    lVar17 = sendbuf->off - sVar5;
                    sendbuf->base[sVar5 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                    sendbuf->base[sVar5 - 1] = (uint8_t)lVar17;
                    uVar13 = ptls_buffer__do_pushv(sendbuf,"",1);
                    if (uVar13 == 0) {
                      sVar5 = sendbuf->off;
                      local_1aa = 0;
                      uVar13 = ptls_buffer__do_pushv(sendbuf,&local_1aa,1);
                      if (uVar13 == 0) {
                        sendbuf->base[sVar5 - 1] = (char)(int)sendbuf->off - (char)sVar5;
                        uVar13 = ptls_buffer__do_pushv(sendbuf,"",2);
                        if (uVar13 == 0) {
                          sVar5 = sendbuf->off;
                          local_174[9] = 0x2b00;
                          uVar13 = ptls_buffer__do_pushv(sendbuf,local_174 + 9,2);
                          if ((uVar13 == 0) &&
                             (uVar13 = ptls_buffer__do_pushv(sendbuf,"",2), uVar13 == 0)) {
                            sVar8 = sendbuf->off;
                            uVar13 = ptls_buffer__do_pushv(sendbuf,"",1);
                            if (uVar13 == 0) {
                              sVar9 = sendbuf->off;
                              local_174[8] = 0x127f;
                              uVar13 = ptls_buffer__do_pushv(sendbuf,local_174 + 8,2);
                              if (uVar13 == 0) {
                                sendbuf->base[sVar9 - 1] = (char)(int)sendbuf->off - (char)sVar9;
                                lVar17 = sendbuf->off - sVar8;
                                sendbuf->base[sVar8 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                                sendbuf->base[sVar8 - 1] = (uint8_t)lVar17;
                                local_174[7] = 0xd00;
                                uVar13 = ptls_buffer__do_pushv(sendbuf,local_174 + 7,2);
                                if ((uVar13 == 0) &&
                                   (uVar13 = ptls_buffer__do_pushv(sendbuf,"",2), uVar13 == 0)) {
                                  sVar8 = sendbuf->off;
                                  uVar13 = ptls_buffer__do_pushv(sendbuf,"",2);
                                  if (uVar13 == 0) {
                                    sVar9 = sendbuf->off;
                                    local_174[6] = 0x408;
                                    uVar13 = ptls_buffer__do_pushv(sendbuf,local_174 + 6,2);
                                    if (uVar13 == 0) {
                                      local_174[5] = 0x304;
                                      uVar13 = ptls_buffer__do_pushv(sendbuf,local_174 + 5,2);
                                      if (uVar13 == 0) {
                                        local_174[4] = 0x104;
                                        uVar13 = ptls_buffer__do_pushv(sendbuf,local_174 + 4,2);
                                        if (uVar13 == 0) {
                                          local_174[3] = 0x102;
                                          uVar13 = ptls_buffer__do_pushv(sendbuf,local_174 + 3,2);
                                          if (uVar13 == 0) {
                                            lVar17 = sendbuf->off - sVar9;
                                            sendbuf->base[sVar9 - 2] = (uint8_t)((ulong)lVar17 >> 8)
                                            ;
                                            sendbuf->base[sVar9 - 1] = (uint8_t)lVar17;
                                            lVar17 = sendbuf->off - sVar8;
                                            sendbuf->base[sVar8 - 2] = (uint8_t)((ulong)lVar17 >> 8)
                                            ;
                                            sendbuf->base[sVar8 - 1] = (uint8_t)lVar17;
                                            local_174[2] = 0xa00;
                                            uVar13 = ptls_buffer__do_pushv(sendbuf,local_174 + 2,2);
                                            if ((uVar13 == 0) &&
                                               (uVar13 = ptls_buffer__do_pushv(sendbuf,"",2),
                                               uVar13 == 0)) {
                                              local_188 = sendbuf->off;
                                              pppVar21 = tls->ctx->key_exchanges;
                                              uVar13 = ptls_buffer__do_pushv(sendbuf,"",2);
                                              if (uVar13 == 0) {
                                                sVar8 = sendbuf->off;
                                                goto LAB_0010d09d;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  uVar3 = (*pppVar14)->id;
                  max_early_data_size = CONCAT22(max_early_data_size._2_2_,uVar3 << 8 | uVar3 >> 8);
                  uVar13 = ptls_buffer__do_pushv(sendbuf,&max_early_data_size,2);
                  pppVar14 = pppVar14 + 1;
                } while (uVar13 == 0);
              }
            }
          }
        }
      }
    }
LAB_0010cff5:
    (*ptls_clear_memory)(decryptbuf_small,0x40);
    return uVar13;
  }
  decryptbuf.base = decryptbuf_small;
  decryptbuf.off = 0;
  decryptbuf.capacity = 0x100;
  decryptbuf.is_allocated = 0;
  pvVar20 = (void *)(*inlen + (long)input);
  uVar13 = 0x202;
  local_1a0 = inlen;
  for (; (uVar13 == 0x202 && (input != pvVar20)); input = (void *)((long)input + consumed)) {
    consumed = (long)pvVar20 - (long)input;
    uVar13 = handle_input(tls,sendbuf,&decryptbuf,input,&consumed,properties);
    if (decryptbuf.off != 0) {
      __assert_fail("decryptbuf.off == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                    ,0x901,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
  }
  ptls_buffer_dispose(&decryptbuf);
  if (uVar13 == 0) {
    bVar2 = *(byte *)&(tls->field_7).server;
    uVar13 = 0;
    if ((bVar2 & 1) == 0) goto LAB_0010c9ea;
    *(byte *)&(tls->field_7).server = bVar2 & 0xfe;
    uVar13 = send_session_ticket(tls,sendbuf);
  }
  if ((uVar13 != 0) && (uVar13 != 0x202)) {
    (*ptls_clear_memory)(sendbuf->base + sVar5,sendbuf->off - sVar5);
    sendbuf->off = sVar5;
    if ((uVar13 & 0xffffff00) != 0x100) {
      description = 'P';
      if ((uVar13 & 0xffffff00) == 0) {
        description = (uint8_t)uVar13;
      }
      iVar12 = send_alert(tls,sendbuf,'\x02',description);
      if (iVar12 != 0) {
        sendbuf->off = sVar5;
      }
    }
  }
LAB_0010c9ea:
  *local_1a0 = (long)input + (*local_1a0 - (long)pvVar20);
  return uVar13;
  while( true ) {
    uVar3 = (*pppVar21)->id;
    local_1ac = uVar3 << 8 | uVar3 >> 8;
    uVar13 = ptls_buffer__do_pushv(sendbuf,&local_1ac,2);
    pppVar21 = pppVar21 + 1;
    if (uVar13 != 0) break;
LAB_0010d09d:
    if (*pppVar21 == (ptls_key_exchange_algorithm_t *)0x0) {
      lVar17 = sendbuf->off - sVar8;
      sendbuf->base[sVar8 - 2] = (uint8_t)((ulong)lVar17 >> 8);
      sendbuf->base[sVar8 - 1] = (uint8_t)lVar17;
      lVar17 = sendbuf->off - local_188;
      sendbuf->base[local_188 - 2] = (uint8_t)((ulong)lVar17 >> 8);
      sendbuf->base[local_188 - 1] = (uint8_t)lVar17;
      local_174[1] = 0x2800;
      uVar13 = ptls_buffer__do_pushv(sendbuf,local_174 + 1,2);
      if ((uVar13 == 0) && (uVar13 = ptls_buffer__do_pushv(sendbuf,"",2), uVar13 == 0)) {
        pppVar21 = tls->ctx->key_exchanges;
        ppVar10 = *pppVar21;
        if (ppVar10 == (ptls_key_exchange_algorithm_t *)0x0) {
          __assert_fail("*algo != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                        ,0x398,
                        "int send_client_hello(ptls_t *, ptls_buffer_t *, ptls_handshake_properties_t *)"
                       );
        }
        sVar8 = sendbuf->off;
        uVar13 = (*ppVar10->create)(&(tls->field_7).client.key_exchange.ctx,
                                    (ptls_iovec_t *)decryptbuf_small);
        if (uVar13 == 0) {
          (tls->field_7).client.key_exchange.algo = *pppVar21;
          uVar13 = ptls_buffer__do_pushv(sendbuf,"",2);
          if (uVar13 == 0) {
            sVar9 = sendbuf->off;
            uVar3 = ((tls->field_7).client.key_exchange.algo)->id;
            local_174[0] = uVar3 << 8 | uVar3 >> 8;
            uVar13 = ptls_buffer__do_pushv(sendbuf,local_174,2);
            if ((uVar13 == 0) && (uVar13 = ptls_buffer__do_pushv(sendbuf,"",2), uVar13 == 0)) {
              sVar18 = sendbuf->off;
              uVar13 = ptls_buffer__do_pushv
                                 (sendbuf,(void *)decryptbuf_small._0_8_,decryptbuf_small._8_8_);
              if (uVar13 == 0) {
                lVar17 = sendbuf->off - sVar18;
                sendbuf->base[sVar18 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                sendbuf->base[sVar18 - 1] = (uint8_t)lVar17;
                lVar17 = sendbuf->off - sVar9;
                sendbuf->base[sVar9 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                sendbuf->base[sVar9 - 1] = (uint8_t)lVar17;
                lVar17 = sendbuf->off - sVar8;
                sendbuf->base[sVar8 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                sendbuf->base[sVar8 - 1] = (uint8_t)lVar17;
                if (local_1a8 == (ushort *)0x0) goto LAB_0010d4e4;
                if (((tls->field_7).client.field_0x20 & 2) == 0) goto LAB_0010d281;
                local_176 = 0x2a00;
                uVar13 = ptls_buffer__do_pushv(sendbuf,&local_176,2);
                if ((uVar13 == 0) && (uVar13 = ptls_buffer__do_pushv(sendbuf,"",2), uVar13 == 0)) {
                  sVar8 = sendbuf->off;
                  for (lVar17 = -2; lVar17 != 0; lVar17 = lVar17 + 1) {
                    sendbuf->base[lVar17 + sVar8] = '\0';
                  }
LAB_0010d281:
                  local_178 = 0x2d00;
                  uVar13 = ptls_buffer__do_pushv(sendbuf,&local_178,2);
                  if ((uVar13 == 0) && (uVar13 = ptls_buffer__do_pushv(sendbuf,"",2), uVar13 == 0))
                  {
                    sVar8 = sendbuf->off;
                    if (tls->ctx->require_dhe_on_psk == 0) {
                      local_1ad = 0;
                      uVar13 = ptls_buffer__do_pushv(sendbuf,&local_1ad,1);
                      if (uVar13 != 0) break;
                    }
                    local_1ae = 1;
                    uVar13 = ptls_buffer__do_pushv(sendbuf,&local_1ae,1);
                    if (uVar13 == 0) {
                      lVar17 = sendbuf->off - sVar8;
                      sendbuf->base[sVar8 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                      sendbuf->base[sVar8 - 1] = (uint8_t)lVar17;
                      local_17a = 0x2900;
                      uVar13 = ptls_buffer__do_pushv(sendbuf,&local_17a,2);
                      if ((uVar13 == 0) &&
                         (uVar13 = ptls_buffer__do_pushv(sendbuf,"",2), uVar13 == 0)) {
                        local_188 = sendbuf->off;
                        uVar13 = ptls_buffer__do_pushv(sendbuf,"",2);
                        if (uVar13 != 0) break;
                        sVar8 = sendbuf->off;
                        uVar13 = ptls_buffer__do_pushv(sendbuf,"",2);
                        if (uVar13 == 0) {
                          sVar9 = sendbuf->off;
                          uVar13 = ptls_buffer__do_pushv
                                             (sendbuf,decryptbuf.base,decryptbuf.capacity);
                          sVar18 = consumed;
                          if (uVar13 == 0) {
                            lVar17 = sendbuf->off - sVar9;
                            sendbuf->base[sVar9 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                            sendbuf->base[sVar9 - 1] = (uint8_t)lVar17;
                            consumed._4_4_ = SUB84(sVar18,4);
                            consumed._0_4_ =
                                 CONCAT13((char)local_1a0,
                                          CONCAT12((char)((ulong)local_1a0 >> 8),
                                                   CONCAT11((char)((ulong)local_1a0 >> 0x10),
                                                            (char)((ulong)local_1a0 >> 0x18))));
                            uVar13 = ptls_buffer__do_pushv(sendbuf,&consumed,4);
                            if (uVar13 == 0) {
                              lVar17 = sendbuf->off - sVar8;
                              sendbuf->base[sVar8 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                              sendbuf->base[sVar8 - 1] = (uint8_t)lVar17;
                              uVar13 = ptls_buffer__do_pushv(sendbuf,"",2);
                              if (uVar13 == 0) {
                                sVar8 = sendbuf->off;
                                uVar13 = ptls_buffer__do_pushv(sendbuf,"",1);
                                if (uVar13 == 0) {
                                  sVar9 = sendbuf->off;
                                  uVar13 = ptls_buffer_reserve(sendbuf,tls->key_schedule->algo->
                                                                       digest_size);
                                  if (uVar13 == 0) {
                                    sVar18 = sendbuf->off + tls->key_schedule->algo->digest_size;
                                    sendbuf->off = sVar18;
                                    sendbuf->base[sVar9 - 1] = (char)sVar18 - (char)sVar9;
                                    lVar17 = sendbuf->off - sVar8;
                                    sendbuf->base[sVar8 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                                    sendbuf->base[sVar8 - 1] = (uint8_t)lVar17;
                                    lVar17 = sendbuf->off - local_188;
                                    sendbuf->base[local_188 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                                    sendbuf->base[local_188 - 1] = (uint8_t)lVar17;
LAB_0010d4e4:
                                    lVar17 = sendbuf->off - sVar5;
                                    sendbuf->base[sVar5 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                                    sendbuf->base[sVar5 - 1] = (uint8_t)lVar17;
                                    uVar16 = sendbuf->off - sVar25;
                                    for (lVar17 = 0x10; lVar17 != -8; lVar17 = lVar17 + -8) {
                                      sendbuf->base[sVar25 - 3] =
                                           (uint8_t)(uVar16 >> ((byte)lVar17 & 0x3f));
                                      sVar25 = sVar25 + 1;
                                    }
                                    lVar17 = sendbuf->off - sVar7;
                                    sendbuf->base[sVar7 - 2] = (uint8_t)((ulong)lVar17 >> 8);
                                    sendbuf->base[sVar7 - 1] = (uint8_t)lVar17;
                                    lVar17 = lVar26;
                                    if (local_1a8 != (ushort *)0x0) {
                                      lVar22 = sendbuf->off - tls->key_schedule->algo->digest_size;
                                      psVar11 = tls->key_schedule->msghash;
                                      lVar17 = lVar22 + -3;
                                      (*psVar11->update)(psVar11,sendbuf->base + lVar26,
                                                         lVar17 - lVar26);
                                      uVar13 = derive_secret(tls->key_schedule,decryptbuf_small,
                                                             "resumption psk binder key");
                                      if ((uVar13 != 0) ||
                                         (uVar13 = calc_verify_data(sendbuf->base + lVar22,
                                                                    tls->key_schedule,
                                                                    decryptbuf_small), uVar13 != 0))
                                      break;
                                    }
                                    psVar11 = tls->key_schedule->msghash;
                                    (*psVar11->update)(psVar11,sendbuf->base + lVar17,
                                                       sendbuf->off - lVar17);
                                    if (((tls->field_7).client.field_0x20 & 2) == 0) {
                                      tls->state = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
                                    }
                                    else {
                                      uVar13 = setup_traffic_protection
                                                         (tls,local_160,1,
                                                          "client early traffic secret");
                                      if (uVar13 != 0) break;
                                      tls->state = PTLS_STATE_CLIENT_SEND_EARLY_DATA;
                                    }
                                    uVar13 = 0x202;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0010cff5;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    size_t sendbuf_orig_off = sendbuf->off;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START:
        assert(input == NULL || *inlen == 0);
        return send_client_hello(tls, sendbuf, properties);
    case PTLS_STATE_CLIENT_SEND_EARLY_DATA:
        if ((ret = send_alert(tls, sendbuf, PTLS_ALERT_LEVEL_WARNING, PTLS_ALERT_END_OF_EARLY_DATA)) != 0)
            return ret;
        tls->state = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
        break;
    default:
        break;
    }

    const uint8_t *src = input, *src_end = src + *inlen;
    ptls_buffer_t decryptbuf;
    uint8_t decryptbuf_small[256];

    ptls_buffer_init(&decryptbuf, decryptbuf_small, sizeof(decryptbuf_small));

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;
    while (ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, sendbuf, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    if (ret == 0 && tls->server.send_ticket) {
        tls->server.send_ticket = 0;
        ret = send_session_ticket(tls, sendbuf);
    }

    if (!(ret == 0 || ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS)) {
        /* flush partially written response */
        ptls_clear_memory(sendbuf->base + sendbuf_orig_off, sendbuf->off - sendbuf_orig_off);
        sendbuf->off = sendbuf_orig_off;
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (send_alert(tls, sendbuf, PTLS_ALERT_LEVEL_FATAL,
                           PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                sendbuf->off = sendbuf_orig_off;
    }

    *inlen -= src_end - src;
    return ret;
}